

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::additional_fixed_sample_mask_str_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this)

{
  size_t sVar1;
  char print_buffer [32];
  char acStack_38 [40];
  
  snprintf(acStack_38,0x20,"0x%x",(ulong)(this->msl_options).additional_fixed_sample_mask);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_38);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_38,acStack_38 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::additional_fixed_sample_mask_str() const
{
	char print_buffer[32];
#ifdef _MSC_VER
	// snprintf does not exist or is buggy on older MSVC versions, some of
	// them being used by MinGW. Use sprintf instead and disable
	// corresponding warning.
#pragma warning(push)
#pragma warning(disable : 4996)
#endif
#if _WIN32
	sprintf(print_buffer, "0x%x", msl_options.additional_fixed_sample_mask);
#else
	snprintf(print_buffer, sizeof(print_buffer), "0x%x", msl_options.additional_fixed_sample_mask);
#endif
#ifdef _MSC_VER
#pragma warning(pop)
#endif
	return print_buffer;
}